

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O3

void __thiscall
FluidSynthMIDIDevice::HandleEvent(FluidSynthMIDIDevice *this,int status,int parm1,int parm2)

{
  uint uVar1;
  undefined8 in_RAX;
  code *UNRECOVERED_JUMPTABLE_00;
  undefined4 in_register_0000000c;
  char *__function;
  undefined4 in_register_00000014;
  ulong uVar2;
  fluid_synth_t *pfVar3;
  
  uVar2 = CONCAT44(in_register_00000014,parm1);
  uVar1 = (status & 0xf0U) - 0x80 >> 4;
  if (6 < uVar1) {
switchD_00340bf4_caseD_2:
    return;
  }
  switch(uVar1) {
  case 0:
    UNRECOVERED_JUMPTABLE_00 = (code *)fluid_synth_noteoff.proc.Call;
    if (FluidSynthModule.handle == (void *)0x0) goto LAB_00340c8e;
    goto LAB_00340c87;
  case 1:
    UNRECOVERED_JUMPTABLE_00 = (code *)fluid_synth_noteon.proc.Call;
    break;
  case 2:
    goto switchD_00340bf4_caseD_2;
  case 3:
    UNRECOVERED_JUMPTABLE_00 = (code *)fluid_synth_cc.proc.Call;
    break;
  case 4:
    UNRECOVERED_JUMPTABLE_00 = (code *)fluid_synth_program_change.proc.Call;
    goto joined_r0x00340c7e;
  case 5:
    UNRECOVERED_JUMPTABLE_00 = (code *)fluid_synth_channel_pressure.proc.Call;
joined_r0x00340c7e:
    if (FluidSynthModule.handle != (void *)0x0) {
LAB_00340c87:
      pfVar3 = this->FluidSynth;
LAB_00340c8b:
      (*UNRECOVERED_JUMPTABLE_00)(pfVar3,status & 0xfU,uVar2,in_RAX);
      return;
    }
LAB_00340c8e:
    __function = 
    "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *, int, int)>::operator int (*)(fluid_synth_t *, int, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *, int, int)]"
    ;
    goto LAB_00340cba;
  case 6:
    if (FluidSynthModule.handle != (void *)0x0) {
      pfVar3 = this->FluidSynth;
      uVar2 = (ulong)((parm2 & 0x7fU) << 7 | parm1 & 0x7fU);
      UNRECOVERED_JUMPTABLE_00 = (code *)fluid_synth_pitch_bend.proc.Call;
      goto LAB_00340c8b;
    }
    goto LAB_00340c8e;
  }
  if (FluidSynthModule.handle != (void *)0x0) {
    (*UNRECOVERED_JUMPTABLE_00)
              (this->FluidSynth,status & 0xfU,uVar2,CONCAT44(in_register_0000000c,parm2),in_RAX);
    return;
  }
  __function = 
  "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *, int, int, int)>::operator int (*)(fluid_synth_t *, int, int, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *, int, int, int)]"
  ;
LAB_00340cba:
  __assert_fail("Module.IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./i_module.h"
                ,0xd2,__function);
}

Assistant:

void FluidSynthMIDIDevice::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int channel = status & 0x0F;
	
	switch (command)
	{
	case MIDI_NOTEOFF:
		fluid_synth_noteoff(FluidSynth, channel, parm1);
		break;

	case MIDI_NOTEON:
		fluid_synth_noteon(FluidSynth, channel, parm1, parm2);
		break;

	case MIDI_POLYPRESS:
		break;

	case MIDI_CTRLCHANGE:
		fluid_synth_cc(FluidSynth, channel, parm1, parm2);
		break;

	case MIDI_PRGMCHANGE:
		fluid_synth_program_change(FluidSynth, channel, parm1);
		break;

	case MIDI_CHANPRESS:
		fluid_synth_channel_pressure(FluidSynth, channel, parm1);
		break;

	case MIDI_PITCHBEND:
		fluid_synth_pitch_bend(FluidSynth, channel, (parm1 & 0x7f) | ((parm2 & 0x7f) << 7));
		break;
	}
}